

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_bdc42::StateBasic::Run(StateBasic *this)

{
  Test *pTVar1;
  bool bVar2;
  Rule *this_00;
  Edge *pEVar3;
  Node *pNVar4;
  StringPiece local_260;
  StringPiece local_250;
  StringPiece local_240;
  string local_230;
  StringPiece local_210;
  StringPiece local_200;
  StringPiece local_1f0;
  Edge *local_1e0;
  Edge *edge;
  string local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  Rule *local_188;
  Rule *rule;
  StringPiece local_170;
  StringPiece local_160 [2];
  StringPiece local_140;
  undefined1 local_130 [8];
  EvalString command;
  State state;
  StateBasic *this_local;
  
  state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  State::State((State *)&command.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  EvalString::EvalString((EvalString *)local_130);
  StringPiece::StringPiece(&local_140,"cat ");
  EvalString::AddText((EvalString *)local_130,local_140);
  StringPiece::StringPiece(local_160,"in");
  EvalString::AddSpecial((EvalString *)local_130,local_160[0]);
  StringPiece::StringPiece(&local_170," > ");
  EvalString::AddText((EvalString *)local_130,local_170);
  StringPiece::StringPiece((StringPiece *)&rule,"out");
  EvalString::AddSpecial((EvalString *)local_130,_rule);
  this_00 = (Rule *)operator_new(0x50);
  local_1aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"cat",&local_1a9);
  Rule::Rule(this_00,&local_1a8);
  local_1aa = 0;
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  local_188 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"command",(allocator<char> *)((long)&edge + 7));
  Rule::AddBinding(this_00,&local_1d0,(EvalString *)local_130);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&edge + 7));
  BindingEnv::AddRule((BindingEnv *)
                      &state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,local_188);
  pEVar3 = State::AddEdge((State *)&command.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_188);
  local_1e0 = pEVar3;
  StringPiece::StringPiece(&local_1f0,"in1");
  State::AddIn((State *)&command.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar3,local_1f0,0);
  pEVar3 = local_1e0;
  StringPiece::StringPiece(&local_200,"in2");
  State::AddIn((State *)&command.parsed_.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar3,local_200,0);
  pEVar3 = local_1e0;
  StringPiece::StringPiece(&local_210,"out");
  State::AddOut((State *)&command.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pEVar3,local_210,0);
  pTVar1 = g_current_test;
  Edge::EvaluateCommand_abi_cxx11_(&local_230,local_1e0,false);
  bVar2 = std::operator==("cat in1 in2 > out",&local_230);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/state_test.cc",
             0x29,"\"cat in1 in2 > out\" == edge->EvaluateCommand()");
  std::__cxx11::string::~string((string *)&local_230);
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_240,"in1");
  pNVar4 = State::GetNode((State *)&command.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_240,0);
  bVar2 = Node::dirty(pNVar4);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/state_test.cc",
             0x2b,"state.GetNode(\"in1\", 0)->dirty()");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_250,"in2");
  pNVar4 = State::GetNode((State *)&command.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_250,0);
  bVar2 = Node::dirty(pNVar4);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/state_test.cc",
             0x2c,"state.GetNode(\"in2\", 0)->dirty()");
  pTVar1 = g_current_test;
  StringPiece::StringPiece(&local_260,"out");
  pNVar4 = State::GetNode((State *)&command.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_260,0);
  bVar2 = Node::dirty(pNVar4);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/state_test.cc",
             0x2d,"state.GetNode(\"out\", 0)->dirty()");
  EvalString::~EvalString((EvalString *)local_130);
  State::~State((State *)&command.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(State, Basic) {
  State state;

  EvalString command;
  command.AddText("cat ");
  command.AddSpecial("in");
  command.AddText(" > ");
  command.AddSpecial("out");

  Rule* rule = new Rule("cat");
  rule->AddBinding("command", command);
  state.bindings_.AddRule(rule);

  Edge* edge = state.AddEdge(rule);
  state.AddIn(edge, "in1", 0);
  state.AddIn(edge, "in2", 0);
  state.AddOut(edge, "out", 0);

  EXPECT_EQ("cat in1 in2 > out", edge->EvaluateCommand());

  EXPECT_FALSE(state.GetNode("in1", 0)->dirty());
  EXPECT_FALSE(state.GetNode("in2", 0)->dirty());
  EXPECT_FALSE(state.GetNode("out", 0)->dirty());
}